

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

Value * __thiscall
duckdb::MultiFileColumnMapper::GetConstantValue
          (Value *__return_storage_ptr__,MultiFileColumnMapper *this,idx_t global_index)

{
  size_type __n;
  MultiFileReaderData *pMVar1;
  const_reference pvVar2;
  reference this_00;
  pointer pEVar3;
  BoundConstantExpression *pBVar4;
  reference pvVar5;
  Value *other;
  const_reference pvVar6;
  InternalException *this_01;
  idx_t i;
  ulong __n_00;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pvVar2 = vector<duckdb::ColumnIndex,_true>::get<true>(this->global_column_ids,global_index);
  __n = pvVar2->index;
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&this->reader_data->expressions,global_index);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((pEVar3->super_BaseExpression).type == VALUE_CONSTANT) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    pBVar4 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar3->super_BaseExpression);
    other = &pBVar4->value;
  }
  else {
    __n_00 = 0;
    do {
      pMVar1 = this->reader_data;
      if ((ulong)(((long)(pMVar1->constant_map).constant_map.
                         super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                         .
                         super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pMVar1->constant_map).constant_map.
                        super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                        .
                        super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x48) <= __n_00) {
        pvVar6 = vector<duckdb::MultiFileColumnDefinition,_true>::get<true>
                           (this->global_columns,__n);
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   "Column \'%s\' is not present in the file, but no constant_map entry exists for it!"
                   ,&local_71);
        ::std::__cxx11::string::string((string *)&local_70,(string *)pvVar6);
        InternalException::InternalException<std::__cxx11::string>(this_01,&local_50,&local_70);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar5 = vector<duckdb::MultiFileConstantEntry,_true>::get<true>
                         (&(pMVar1->constant_map).constant_map,__n_00);
      __n_00 = __n_00 + 1;
    } while ((pvVar5->column_idx).index != global_index);
    other = &pvVar5->value;
  }
  Value::Value(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Value MultiFileColumnMapper::GetConstantValue(idx_t global_index) {
	auto global_column_id = global_column_ids[global_index].GetPrimaryIndex();
	auto &expr = reader_data.expressions[global_index];
	if (expr->type == ExpressionType::VALUE_CONSTANT) {
		return expr->Cast<BoundConstantExpression>().value;
	}
	for (idx_t i = 0; i < reader_data.constant_map.size(); i++) {
		auto &constant_map_entry = reader_data.constant_map[MultiFileConstantMapIndex(i)];
		if (constant_map_entry.column_idx.GetIndex() == global_index) {
			return constant_map_entry.value;
		}
	}
	auto &global_column = global_columns[global_column_id];
	throw InternalException("Column '%s' is not present in the file, but no constant_map entry exists for it!",
	                        global_column.name);
}